

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O3

uint Fxu_PairHashKey(Fxu_Matrix *p,Fxu_Cube *pCube1,Fxu_Cube *pCube2,int *pnBase,int *pnLits1,
                    int *pnLits2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Fxu_ListLit *pFVar4;
  Fxu_Lit *pFVar5;
  uint uVar6;
  Fxu_ListLit *pFVar7;
  Fxu_Lit *pFVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  pFVar7 = &pCube1->lLits;
  pFVar4 = &pCube2->lLits;
  iVar9 = 0;
  iVar10 = 0;
  iVar11 = 0;
  uVar3 = 0;
LAB_004baa64:
  pFVar5 = pFVar4->pHead;
  do {
    pFVar8 = pFVar7->pHead;
    while( true ) {
      for (; (pFVar8 == (Fxu_Lit *)0x0 || (pFVar5 == (Fxu_Lit *)0x0)); pFVar5 = pFVar5->pHNext) {
        if ((pFVar8 != (Fxu_Lit *)0x0) && (pFVar5 == (Fxu_Lit *)0x0)) {
          uVar6 = pFVar8->iVar * s_Primes[(long)iVar10 + 100];
          pFVar5 = (Fxu_Lit *)0x0;
          goto LAB_004baad8;
        }
        if ((pFVar8 != (Fxu_Lit *)0x0) || (pFVar5 == (Fxu_Lit *)0x0)) {
          *pnBase = iVar9;
          *pnLits1 = iVar10;
          *pnLits2 = iVar11;
          return uVar3;
        }
        uVar3 = uVar3 ^ pFVar5->iVar * s_Primes[iVar11 + 200];
        iVar11 = iVar11 + 1;
        pFVar8 = (Fxu_Lit *)0x0;
      }
      iVar1 = pFVar8->iVar;
      iVar2 = pFVar5->iVar;
      if (iVar1 == iVar2) {
        pFVar7 = (Fxu_ListLit *)&pFVar8->pHNext;
        pFVar4 = (Fxu_ListLit *)&pFVar5->pHNext;
        iVar9 = iVar9 + 1;
        goto LAB_004baa64;
      }
      if (iVar1 < iVar2) break;
      uVar3 = uVar3 ^ iVar2 * s_Primes[iVar11 + 200];
      pFVar5 = pFVar5->pHNext;
      iVar11 = iVar11 + 1;
    }
    uVar6 = iVar1 * s_Primes[(long)iVar10 + 100];
LAB_004baad8:
    uVar3 = uVar3 ^ uVar6;
    pFVar7 = (Fxu_ListLit *)&pFVar8->pHNext;
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

unsigned Fxu_PairHashKey( Fxu_Matrix * p, Fxu_Cube * pCube1, Fxu_Cube * pCube2, 
                         int * pnBase, int * pnLits1, int * pnLits2 )
{
    int Offset1 = 100, Offset2 = 200;
    int nBase, nLits1, nLits2;
    Fxu_Lit * pLit1, * pLit2;
    unsigned Key;

    // compute the hash key
    Key    = 0;
    nLits1 = 0;
    nLits2 = 0;
    nBase  = 0;
    pLit1  = pCube1->lLits.pHead;
    pLit2  = pCube2->lLits.pHead;
    while ( 1 )
    {
        if ( pLit1 && pLit2 )
        {
            if ( pLit1->iVar == pLit2->iVar )
            { // ensure cube-free
                pLit1 = pLit1->pHNext;
                pLit2 = pLit2->pHNext;
                // add this literal to the base
                nBase++;
            }
            else if ( pLit1->iVar < pLit2->iVar )
            {
                Key  ^= s_Primes[Offset1+nLits1] * pLit1->iVar;
                pLit1 = pLit1->pHNext;
                nLits1++;
            }
            else
            {
                Key  ^= s_Primes[Offset2+nLits2] * pLit2->iVar;
                pLit2 = pLit2->pHNext;
                nLits2++;
            }
        }
        else if ( pLit1 && !pLit2 )
        {
            Key  ^= s_Primes[Offset1+nLits1] * pLit1->iVar;
            pLit1 = pLit1->pHNext;
            nLits1++;
        }
        else if ( !pLit1 && pLit2 )
        {
            Key  ^= s_Primes[Offset2+nLits2] * pLit2->iVar;
            pLit2 = pLit2->pHNext;
            nLits2++;
        }
        else
            break;
    }
    *pnBase  = nBase;
    *pnLits1 = nLits1;
    *pnLits2 = nLits2;
    return Key;
}